

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

bool __thiscall
VulkanHppGenerator::determineEnumeration
          (VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  
  p_Var6 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
  bVar9 = (_Rb_tree_header *)p_Var6 != p_Var7;
  if (bVar9) {
    puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    bVar9 = true;
    do {
      bVar10 = puVar1 == puVar2;
      if (puVar1 == puVar2) {
LAB_0013cd0a:
        if (!bVar10) goto LAB_0013cd0f;
      }
      else {
        uVar3 = *puVar1;
        puVar5 = puVar1 + 1;
        while (*(unsigned_long *)(p_Var6 + 1) != uVar3) {
          bVar10 = puVar5 == puVar2;
          if (bVar10) goto LAB_0013cd0a;
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
        }
LAB_0013cd0f:
        if (puVar1 == puVar2 || *(byte *)&p_Var6[1]._M_right != 0) {
          bVar8 = puVar1 != puVar2 | *(byte *)&p_Var6[1]._M_right;
        }
        else {
          p_Var4 = (_Base_ptr)*puVar1;
          puVar5 = puVar1 + 1;
          while( true ) {
            if (p_Var6[1]._M_parent == p_Var4) {
              return bVar9;
            }
            bVar8 = puVar5 != puVar2;
            if (!(bool)bVar8) break;
            p_Var4 = (_Base_ptr)*puVar5;
            puVar5 = puVar5 + 1;
          }
        }
        if (bVar8 != 0) {
          return bVar9;
        }
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      bVar9 = (_Rb_tree_header *)p_Var6 != p_Var7;
    } while (bVar9);
  }
  return bVar9;
}

Assistant:

bool VulkanHppGenerator::determineEnumeration( std::map<size_t, VectorParamData> const & vectorParams, std::vector<size_t> const & returnParams ) const
{
  // a command is considered to be enumerating some data, if for at least one vectorParam the data is a returnParam and either the vectorParams is
  // specified by a structure or the lenParam is a returnParam as well
  return std::ranges::any_of( vectorParams,
                              [&returnParams]( auto const & vp )
                              {
                                return std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.first; } ) &&
                                       ( vp.second.byStructure ||
                                         std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.second.lenParam; } ) );
                              } );
}